

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

void Fra_ClausRecordClause2(Clu_Man_t *p,Aig_Cut_t *pCut,int iMint,int Cost)

{
  long lVar1;
  
  if ('\0' < pCut->nFanins) {
    lVar1 = 0;
    do {
      Vec_IntPush(p->vLits,(uint)(((uint)iMint >> ((uint)lVar1 & 0x1f) & 1) != 0) +
                           p->pCnf->pVarNums[*(int *)((long)&pCut[1].pNext + lVar1 * 4)] * 2);
      lVar1 = lVar1 + 1;
    } while (lVar1 < pCut->nFanins);
  }
  Vec_IntPush(p->vClauses,p->vLits->nSize);
  Vec_IntPush(p->vCosts,Cost);
  return;
}

Assistant:

void Fra_ClausRecordClause2( Clu_Man_t * p, Aig_Cut_t * pCut, int iMint, int Cost )
{
    int i;
    for ( i = 0; i < (int)pCut->nFanins; i++ )
        Vec_IntPush( p->vLits, toLitCond( p->pCnf->pVarNums[pCut->pFanins[i]], (iMint&(1<<i)) ) );
    Vec_IntPush( p->vClauses, Vec_IntSize(p->vLits) );
    Vec_IntPush( p->vCosts, Cost );
}